

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O1

void __thiscall QTemporaryDir::~QTemporaryDir(QTemporaryDir *this)

{
  QTemporaryDirPrivate *pQVar1;
  Data *pDVar2;
  char *in_RSI;
  
  if (this->d_ptr != (QTemporaryDirPrivate *)0x0) {
    if (this->d_ptr->autoRemove == true) {
      remove(this,in_RSI);
    }
    pQVar1 = this->d_ptr;
    if (pQVar1 != (QTemporaryDirPrivate *)0x0) {
      pDVar2 = (pQVar1->pathOrError).d.d;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + -1);
        UNLOCK();
        if ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
            == 0) {
          QArrayData::deallocate(&((pQVar1->pathOrError).d.d)->super_QArrayData,2,0x10);
        }
      }
      operator_delete(pQVar1,0x20);
      return;
    }
  }
  return;
}

Assistant:

QTemporaryDir::~QTemporaryDir()
{
    if (d_ptr) {
        if (d_ptr->autoRemove)
            remove();

        delete d_ptr;
    }
}